

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryRequirementsTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::memory::anon_unknown_0::testImage
          (TestStatus *__return_storage_ptr__,anon_unknown_0 *this,Context *context,
          ImageParams params)

{
  string *psVar1;
  VkImageTiling VVar2;
  VkImageUsageFlags VVar3;
  TestStatus *__return_storage_ptr___00;
  DeviceInterface *vk;
  VkDeviceSize VVar4;
  int iVar5;
  qpTestResult qVar6;
  uint uVar7;
  uint uVar8;
  InstanceInterface *vk_00;
  ostream *poVar9;
  NotSupportedError *this_00;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  pointer puVar13;
  ulong uVar14;
  char *pcVar15;
  deUint32 dVar16;
  uint uVar17;
  VkImageType VVar18;
  uint uVar19;
  VkPhysicalDevice physicalDevice;
  VkSampleCountFlagBits VVar20;
  bool bVar21;
  VkFormatProperties VVar22;
  allocator<char> local_66e;
  byte local_66d;
  uint local_66c;
  byte local_666;
  byte local_665;
  uint local_664;
  ulong local_660;
  deUint32 local_654;
  undefined4 local_650;
  undefined4 local_64c;
  ulong local_648;
  int local_63c;
  Context *local_638;
  VkPhysicalDevice local_630;
  TestLog *local_628;
  uint local_620;
  uint local_61c;
  uint local_618;
  uint local_614;
  VkImageCreateInfo local_610;
  VkDevice local_5b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> usedMemoryTypeIndices;
  RefBase<vk::Handle<(vk::HandleType)9>_> local_598;
  TestStatus *local_570;
  ulong local_568;
  InstanceInterface *local_560;
  DeviceInterface *local_558;
  VkMemoryRequirements requirements;
  ResultCollector result;
  VkBool32 local_4e8;
  VkBool32 local_4e4;
  VkBool32 local_4e0;
  VkBool32 local_4c0;
  VkBool32 local_480;
  VkBool32 local_47c;
  VkBool32 local_478;
  VkBool32 local_474;
  VkBool32 local_470;
  VkBool32 local_46c;
  string local_3b0 [11];
  VkPhysicalDeviceMemoryProperties memoryProperties;
  
  local_570 = __return_storage_ptr__;
  local_558 = Context::getDeviceInterface((Context *)this);
  vk_00 = Context::getInstanceInterface((Context *)this);
  local_5b8 = Context::getDevice((Context *)this);
  local_630 = Context::getPhysicalDevice((Context *)this);
  ::vk::getPhysicalDeviceFeatures((VkPhysicalDeviceFeatures *)&memoryProperties,vk_00,local_630);
  local_638 = context;
  if ((((ulong)context & 1) == 0) || (memoryProperties.memoryTypes[0x15].heapIndex != 0)) {
    if ((((ulong)context & 2) == 0) ||
       ((memoryProperties.memoryTypes[0x16].heapIndex != 0 ||
        (memoryProperties.memoryTypes[0x17].propertyFlags != 0)))) {
      if ((((ulong)context & 4) == 0) || (memoryProperties.memoryTypes[0x19].heapIndex != 0)) {
        ::vk::getPhysicalDeviceMemoryProperties(&memoryProperties,vk_00,local_630);
        local_628 = *(TestLog **)(*(long *)this + 0x10);
        psVar1 = &result.m_prefix;
        result.m_log = local_628;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
        std::operator<<((ostream *)psVar1,
                        "Verify memory requirements for the following parameter combinations:");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&result,(EndMessageToken *)&tcu::TestLog::EndMessage);
        local_660 = (ulong)local_638 >> 0x20;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
        local_61c = (params.flags & 1) << 6;
        local_66d = 1;
        uVar12 = 0;
        local_63c = 0;
        physicalDevice = local_630;
        local_560 = vk_00;
        do {
          __return_storage_ptr___00 = local_570;
          if ((int)uVar12 == 2) {
            if (local_63c == 0) {
              psVar1 = &result.m_prefix;
              result.m_log = local_628;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
              std::operator<<((ostream *)psVar1,
                              "NOTE: No supported image configurations -- nothing to check");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&result,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
            }
            if ((local_66d & 1) == 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&result,"Some memory requirements were incorrect",
                         (allocator<char> *)local_3b0);
              tcu::TestStatus::fail(__return_storage_ptr___00,(string *)&result);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&result,"Pass",(allocator<char> *)local_3b0);
              tcu::TestStatus::pass(__return_storage_ptr___00,(string *)&result);
            }
            std::__cxx11::string::~string((string *)&result);
            return __return_storage_ptr___00;
          }
          dVar16 = 0xffffffff;
          uVar11 = 1;
          uVar14 = local_660;
          local_568 = uVar12;
          while( true ) {
            iVar5 = (int)uVar12;
            if ((int)uVar11 == 0xb9) break;
            if ((iVar5 == 1) != (int)uVar11 - 0x83U < 0xfffffff9) {
              if (iVar5 == 1) {
                dVar16 = 0xffffffff;
              }
              local_654 = dVar16;
              local_648 = uVar11;
              for (VVar18 = VK_IMAGE_TYPE_1D; uVar12 = local_568, dVar16 = local_654,
                  VVar18 != VK_IMAGE_TYPE_LAST; VVar18 = VVar18 + VK_IMAGE_TYPE_2D) {
                uVar8 = 0;
                while (uVar8 < 0x11) {
                  local_664 = uVar8 | (uint)local_638;
                  uVar10 = local_664 & 0x10;
                  local_66c = (uVar10 >> 4) * 5 + 1;
                  local_666 = (VVar18 != VK_IMAGE_TYPE_2D || uVar10 != 0) || uVar14 != 0;
                  uVar7 = 1;
                  local_620 = uVar8;
                  while (uVar7 < 0x81) {
                    uVar19 = uVar7 | local_61c;
                    local_614 = uVar19 & 0xf0;
                    local_665 = local_614 == 0x40 | local_666;
                    uVar12 = local_648;
                    uVar8 = local_664;
                    uVar17 = local_66c;
                    local_618 = uVar7;
                    VVar20 = VK_SAMPLE_COUNT_1_BIT;
                    while ((int)VVar20 < 0x11) {
                      local_610.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
                      local_610.pNext = (void *)0x0;
                      local_610.format = (VkFormat)uVar12;
                      local_610.extent.width = 0x40;
                      local_610.extent.height = 1;
                      local_610.extent.depth = VK_SAMPLE_COUNT_1_BIT;
                      if (VVar18 != VK_IMAGE_TYPE_1D) {
                        if (VVar18 == VK_IMAGE_TYPE_2D) {
                          local_610.extent.depth = VK_SAMPLE_COUNT_1_BIT;
                        }
                        else {
                          local_610.extent.depth = VK_SAMPLE_COUNT_4_BIT;
                        }
                        local_610.extent.width = 0x40;
                        local_610.extent.height = 0x40;
                      }
                      local_610.mipLevels = 1;
                      local_610.tiling = (VkImageTiling)uVar14;
                      local_610.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
                      local_610.queueFamilyIndexCount = 0;
                      local_610.pQueueFamilyIndices = (deUint32 *)0x0;
                      local_610.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
                      local_610.flags = uVar8;
                      local_610.imageType = VVar18;
                      local_610.arrayLayers = uVar17;
                      local_610.samples = VVar20;
                      local_610.usage = uVar19;
                      if (VVar18 == VK_IMAGE_TYPE_2D || uVar10 == 0) {
                        if (VVar20 == VK_SAMPLE_COUNT_1_BIT) {
                          if (local_614 != 0x40) {
LAB_0063cdfe:
                            ::vk::getPhysicalDeviceFeatures
                                      ((VkPhysicalDeviceFeatures *)&result,vk_00,physicalDevice);
                            uVar14 = local_660;
                            uVar12 = local_648;
                            uVar8 = local_664;
                            uVar17 = local_66c;
                            if ((((local_610.flags & 2) == 0) ||
                                (((((local_610.imageType != VK_IMAGE_TYPE_2D || (local_480 != 0)) &&
                                   ((local_610.imageType != VK_IMAGE_TYPE_3D || (local_47c != 0))))
                                  && (((local_610.samples != VK_SAMPLE_COUNT_2_BIT ||
                                       (local_478 != 0)) &&
                                      ((local_610.samples != VK_SAMPLE_COUNT_4_BIT ||
                                       (local_474 != 0)))))) &&
                                 ((((local_610.samples != VK_SAMPLE_COUNT_8_BIT || (local_470 != 0))
                                   && ((local_610.samples != VK_SAMPLE_COUNT_16_BIT ||
                                       (local_46c != 0)))) &&
                                  ((local_610.samples != VK_SAMPLE_COUNT_32_BIT &&
                                   (local_610.samples != VK_SAMPLE_COUNT_64_BIT)))))))) &&
                               ((local_610.samples == VK_SAMPLE_COUNT_1_BIT ||
                                (((local_610.usage & 8) == 0 || (local_4c0 != 0)))))) {
                              uVar7 = local_610.format - VK_FORMAT_BC1_RGB_UNORM_BLOCK;
                              if (uVar7 < 0x36) {
                                if ((0x3ffffffc000000U >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
                                  if ((short)(1L << ((byte)uVar7 & 0x3f)) == 0) {
                                    if (local_4e8 != 0) goto LAB_0063cf56;
                                  }
                                  else if (local_4e0 != 0) goto LAB_0063cf56;
                                  goto LAB_0063d042;
                                }
                                if (local_4e4 == 0) goto LAB_0063d042;
                              }
LAB_0063cf56:
                              VVar22 = ::vk::getPhysicalDeviceFormatProperties
                                                 (vk_00,physicalDevice,local_610.format);
                              uVar11 = VVar22._0_8_ >> 0x20;
                              if (local_610.tiling == VK_IMAGE_TILING_LINEAR) {
                                uVar11 = (ulong)VVar22.linearTilingFeatures;
                              }
                              if ((((((local_610.usage & 4) != 0) && ((uVar11 & 1) != 0)) ||
                                   (((local_610.usage & 8) != 0 && ((uVar11 & 2) != 0)))) ||
                                  ((((local_610.usage & 0x90) != 0 && ((uVar11 & 0x80) != 0)) ||
                                   ((uVar14 = local_660, uVar12 = local_648, uVar8 = local_664,
                                    uVar17 = local_66c, (local_610.usage & 0x20) != 0 &&
                                    ((uVar11 & 0x200) != 0)))))) &&
                                 ((((iVar5 = (*vk_00->_vptr_InstanceInterface[4])
                                                       (vk_00,physicalDevice,(ulong)local_610.format
                                                        ,(ulong)local_610.imageType,
                                                        (ulong)local_610.tiling,
                                                        (ulong)local_610.usage,
                                                        (ulong)local_610.flags,local_3b0),
                                    uVar14 = local_660, uVar12 = local_648, uVar8 = local_664,
                                    uVar17 = local_66c, iVar5 == 0 &&
                                    (local_610.arrayLayers <= (uint)local_3b0[0].field_2._0_4_)) &&
                                   (local_610.mipLevels <= local_3b0[0]._M_string_length._4_4_)) &&
                                  ((local_610.samples &
                                   local_3b0[0].field_2._M_allocated_capacity._4_4_) != 0)))) {
                                result.m_log = local_628;
                                psVar1 = &result.m_prefix;
                                std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
                                std::operator<<((ostream *)psVar1,"- ");
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_3b0);
                                if ((ulong)local_610.imageType < 3) {
                                  std::operator<<((ostream *)local_3b0,
                                                  &DAT_009a2d2c +
                                                  *(int *)(&DAT_009a2d2c +
                                                          (ulong)local_610.imageType * 4));
                                }
                                pcVar15 = "(optimal) ";
                                if (local_610.tiling == VK_IMAGE_TILING_OPTIMAL) {
LAB_0063d12d:
                                  std::operator<<((ostream *)local_3b0,pcVar15);
                                }
                                else if (local_610.tiling == VK_IMAGE_TILING_LINEAR) {
                                  pcVar15 = "(linear) ";
                                  goto LAB_0063d12d;
                                }
                                poVar9 = std::operator<<((ostream *)local_3b0,"extent:[");
                                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                                poVar9 = std::operator<<(poVar9,", ");
                                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                                poVar9 = std::operator<<(poVar9,", ");
                                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                                std::operator<<(poVar9,"] ");
                                poVar9 = ::vk::operator<<((ostream *)local_3b0,local_610.format);
                                std::operator<<(poVar9," ");
                                poVar9 = std::operator<<((ostream *)local_3b0,"samples:");
                                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                                std::operator<<(poVar9," ");
                                poVar9 = std::operator<<((ostream *)local_3b0,"flags:");
                                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                                std::operator<<(poVar9," ");
                                poVar9 = std::operator<<((ostream *)local_3b0,"usage:");
                                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                                std::operator<<(poVar9," ");
                                std::__cxx11::stringbuf::str();
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_3b0);
                                std::operator<<((ostream *)psVar1,(string *)&local_598);
                                tcu::MessageBuilder::operator<<
                                          ((MessageBuilder *)&result,
                                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                                std::__cxx11::string::~string((string *)&local_598);
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)&result.m_prefix);
                                vk = local_558;
                                ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&result,
                                                  local_558,local_5b8,&local_610,
                                                  (VkAllocationCallbacks *)0x0);
                                local_598.m_data.deleter.m_device =
                                     (VkDevice)result.m_prefix._M_string_length;
                                local_598.m_data.deleter.m_allocator =
                                     (VkAllocationCallbacks *)
                                     result.m_prefix.field_2._M_allocated_capacity;
                                local_598.m_data.object.m_internal = (deUint64)result.m_log;
                                local_598.m_data.deleter.m_deviceIface =
                                     (DeviceInterface *)result.m_prefix._M_dataplus._M_p;
                                result.m_log = (TestLog *)0x0;
                                result.m_prefix._M_dataplus._M_p = (pointer)0x0;
                                result.m_prefix._M_string_length = 0;
                                result.m_prefix.field_2._M_allocated_capacity = 0;
                                ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
                                          ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&result);
                                ::vk::getImageMemoryRequirements
                                          (&requirements,vk,local_5b8,
                                           (VkImage)local_598.m_data.object.m_internal);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)local_3b0,"ERROR: ",
                                           (allocator<char> *)&usedMemoryTypeIndices);
                                tcu::ResultCollector::ResultCollector(&result,local_628,local_3b0);
                                std::__cxx11::string::~string((string *)local_3b0);
                                dVar16 = requirements.memoryTypeBits;
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)local_3b0,
                                           "VkMemoryRequirements memoryTypeBits has no bits set",
                                           (allocator<char> *)&usedMemoryTypeIndices);
                                bVar21 = tcu::ResultCollector::check(&result,dVar16 != 0,local_3b0);
                                std::__cxx11::string::~string((string *)local_3b0);
                                if (bVar21) {
                                  bitsToIndices(&usedMemoryTypeIndices,requirements.memoryTypeBits);
                                  local_650 = 0;
                                  local_64c = 0;
                                  for (puVar13 = usedMemoryTypeIndices.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start;
                                      VVar4 = requirements.alignment, VVar3 = local_610.usage,
                                      puVar13 !=
                                      usedMemoryTypeIndices.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish;
                                      puVar13 = puVar13 + 1) {
                                    if (*puVar13 < memoryProperties.memoryTypeCount) {
                                      uVar8 = memoryProperties.memoryTypes[*puVar13].propertyFlags;
                                      local_650 = CONCAT31((int3)((uint)local_650 >> 8),
                                                           (byte)local_650 | (byte)uVar8);
                                      local_64c = CONCAT31((int3)((uint)local_64c >> 8),
                                                           (byte)local_64c | (uVar8 & 6) != 0);
                                      if ((uVar8 & 0x10) != 0) {
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)local_3b0,
                                                                                                      
                                                  "Memory type includes VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT for a non-transient attachment image"
                                                  ,&local_66e);
                                        tcu::ResultCollector::check
                                                  (&result,SUB41((VVar3 & 0x40) >> 6,0),local_3b0);
                                        goto LAB_0063d4b8;
                                      }
                                    }
                                    else {
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)local_3b0,
                                                 "VkMemoryRequirements memoryTypeBits contains bits for non-existing memory types"
                                                 ,&local_66e);
                                      tcu::ResultCollector::fail(&result,local_3b0);
LAB_0063d4b8:
                                      std::__cxx11::string::~string((string *)local_3b0);
                                    }
                                  }
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_3b0,
                                             "VkMemoryRequirements alignment isn\'t power of two",
                                             &local_66e);
                                  tcu::ResultCollector::check
                                            (&result,(VVar4 & VVar4 - 1) == 0,local_3b0);
                                  std::__cxx11::string::~string((string *)local_3b0);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_3b0,
                                             "None of the required memory types included VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT"
                                             ,&local_66e);
                                  tcu::ResultCollector::check
                                            (&result,(bool)((byte)local_650 & 1),local_3b0);
                                  std::__cxx11::string::~string((string *)local_3b0);
                                  VVar2 = local_610.tiling;
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_3b0,
                                             "Required memory type doesn\'t include VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT and VK_MEMORY_PROPERTY_HOST_COHERENT_BIT"
                                             ,&local_66e);
                                  tcu::ResultCollector::check
                                            (&result,(bool)(VVar2 == VK_IMAGE_TILING_OPTIMAL |
                                                           (byte)local_64c & 1),local_3b0);
                                  std::__cxx11::string::~string((string *)local_3b0);
                                  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::
                                  ~_Vector_base(&usedMemoryTypeIndices.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               );
                                }
                                dVar16 = requirements.memoryTypeBits;
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)local_3b0,
                                           "memoryTypeBits differ from the ones in the previous image configuration"
                                           ,(allocator<char> *)&usedMemoryTypeIndices);
                                tcu::ResultCollector::check
                                          (&result,dVar16 == local_654 || local_654 == 0xffffffff,
                                           local_3b0);
                                physicalDevice = local_630;
                                std::__cxx11::string::~string((string *)local_3b0);
                                qVar6 = tcu::ResultCollector::getResult(&result);
                                local_63c = local_63c + 1;
                                local_66d = local_66d & qVar6 == QP_TEST_RESULT_PASS;
                                local_654 = requirements.memoryTypeBits;
                                tcu::ResultCollector::~ResultCollector(&result);
                                ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
                                          (&local_598);
                                vk_00 = local_560;
                                uVar14 = local_660;
                                uVar12 = local_648;
                                uVar8 = local_664;
                                uVar17 = local_66c;
                              }
                            }
                          }
                        }
                        else if (local_665 == 0) goto LAB_0063cdfe;
                      }
LAB_0063d042:
                      bVar21 = VVar20 == 0;
                      VVar20 = VVar20 * 2;
                      if (bVar21) {
                        VVar20 = VK_SAMPLE_COUNT_1_BIT;
                      }
                    }
                    uVar7 = nextFlagExcluding<unsigned_int>(local_618,0x40);
                    uVar14 = local_660;
                  }
                  uVar8 = nextFlagExcluding<unsigned_int>(local_620,7);
                  uVar14 = local_660;
                  uVar11 = local_648;
                }
              }
            }
            uVar11 = (ulong)((int)uVar11 + 1);
          }
          uVar12 = (ulong)(iVar5 + 1);
        } while( true );
      }
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Feature not supported: sparseResidencyAliased",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryRequirementsTests.cpp"
                 ,0x10d);
    }
    else {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Feature not supported: sparseResidencyImage (2D and 3D)",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryRequirementsTests.cpp"
                 ,0x10a);
    }
  }
  else {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Feature not supported: sparseBinding",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryRequirementsTests.cpp"
               ,0x107);
  }
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus testImage (Context& context, const ImageParams params)
{
	const DeviceInterface&		vk				= context.getDeviceInterface();
	const InstanceInterface&	vki				= context.getInstanceInterface();
	const VkDevice				device			= context.getDevice();
	const VkPhysicalDevice		physDevice		= context.getPhysicalDevice();
	const VkImageCreateFlags	sparseFlags		= VK_IMAGE_CREATE_SPARSE_BINDING_BIT | VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT | VK_IMAGE_CREATE_SPARSE_ALIASED_BIT;
	const VkImageUsageFlags		transientFlags	= VK_IMAGE_USAGE_TRANSIENT_ATTACHMENT_BIT;

	requireImageSparseFeatures(vki, physDevice, params.flags);

	const VkPhysicalDeviceMemoryProperties	memoryProperties		= getPhysicalDeviceMemoryProperties(vki, physDevice);
	const deUint32							notInitializedBits		= ~0u;
	const VkImageAspectFlags				colorAspect				= VK_IMAGE_ASPECT_COLOR_BIT;
	const VkImageAspectFlags				depthStencilAspect		= VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT;
	const VkImageAspectFlags				allAspects[2]			= { colorAspect, depthStencilAspect };
	tcu::TestLog&							log						= context.getTestContext().getLog();
	bool									allPass					= true;
	deUint32								numCheckedImages		= 0u;

	log << tcu::TestLog::Message << "Verify memory requirements for the following parameter combinations:" << tcu::TestLog::EndMessage;

	for (deUint32 loopAspectNdx = 0u; loopAspectNdx < DE_LENGTH_OF_ARRAY(allAspects); ++loopAspectNdx)
	{
		const VkImageAspectFlags	aspect					= allAspects[loopAspectNdx];
		deUint32					previousMemoryTypeBits	= notInitializedBits;

		for (VkFormat loopFormat = VK_FORMAT_R4G4_UNORM_PACK8; loopFormat <= VK_FORMAT_ASTC_12x12_SRGB_BLOCK; loopFormat = nextEnum(loopFormat))
		if  (isFormatMatchingAspect(loopFormat, aspect))
		{
			// memoryTypeBits may differ between depth/stencil formats
			if (aspect == depthStencilAspect)
				previousMemoryTypeBits = notInitializedBits;

			for (VkImageType			loopImageType	= VK_IMAGE_TYPE_1D;					loopImageType	!= VK_IMAGE_TYPE_LAST;					loopImageType	= nextEnum(loopImageType))
			for (VkImageCreateFlags		loopCreateFlags	= (VkImageCreateFlags)0;			loopCreateFlags	<= VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;	loopCreateFlags	= nextFlagExcluding(loopCreateFlags, sparseFlags))
			for (VkImageUsageFlags		loopUsageFlags	= VK_IMAGE_USAGE_TRANSFER_SRC_BIT;	loopUsageFlags	<= VK_IMAGE_USAGE_INPUT_ATTACHMENT_BIT;	loopUsageFlags	= nextFlagExcluding(loopUsageFlags, transientFlags))
			for (VkSampleCountFlagBits	loopSampleCount	= VK_SAMPLE_COUNT_1_BIT;			loopSampleCount	<= VK_SAMPLE_COUNT_16_BIT;				loopSampleCount	= nextFlag(loopSampleCount))
			{
				const VkImageCreateFlags	actualCreateFlags	= loopCreateFlags | params.flags;
				const VkImageUsageFlags		actualUsageFlags	= loopUsageFlags  | (params.transient ? VK_IMAGE_USAGE_TRANSIENT_ATTACHMENT_BIT : (VkImageUsageFlagBits)0);
				const bool					isCube				= (actualCreateFlags & VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT) != 0u;
				const VkImageCreateInfo		imageInfo			=
				{
					VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType          sType;
					DE_NULL,									// const void*              pNext;
					actualCreateFlags,							// VkImageCreateFlags       flags;
					loopImageType,								// VkImageType              imageType;
					loopFormat,									// VkFormat                 format;
					makeExtentForImage(loopImageType),			// VkExtent3D               extent;
					1u,											// uint32_t                 mipLevels;
					(isCube ? 6u : 1u),							// uint32_t                 arrayLayers;
					loopSampleCount,							// VkSampleCountFlagBits    samples;
					params.tiling,								// VkImageTiling            tiling;
					actualUsageFlags,							// VkImageUsageFlags        usage;
					VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode            sharingMode;
					0u,											// uint32_t                 queueFamilyIndexCount;
					DE_NULL,									// const uint32_t*          pQueueFamilyIndices;
					VK_IMAGE_LAYOUT_UNDEFINED,					// VkImageLayout            initialLayout;
				};

				if (!isImageSupported(vki, physDevice, imageInfo))
					continue;

				log << tcu::TestLog::Message << "- " << getImageInfoString(imageInfo) << tcu::TestLog::EndMessage;
				++numCheckedImages;

				const Unique<VkImage>		image			(createImage(vk, device, &imageInfo));
				const VkMemoryRequirements	requirements	= getImageMemoryRequirements(vk, device, *image);
				tcu::ResultCollector		result			(log, "ERROR: ");

				verifyImageRequirements(result, memoryProperties, requirements, imageInfo);

				// For the same tiling, transient usage, and sparse flags, (and format, if D/S) memoryTypeBits must be the same for all images
				result.check((previousMemoryTypeBits == notInitializedBits) || (requirements.memoryTypeBits == previousMemoryTypeBits),
								"memoryTypeBits differ from the ones in the previous image configuration");

				if (result.getResult() != QP_TEST_RESULT_PASS)
					allPass = false;

				previousMemoryTypeBits = requirements.memoryTypeBits;
			}
		}
	}

	if (numCheckedImages == 0u)
		log << tcu::TestLog::Message << "NOTE: No supported image configurations -- nothing to check" << tcu::TestLog::EndMessage;

	return allPass ? tcu::TestStatus::pass("Pass") : tcu::TestStatus::fail("Some memory requirements were incorrect");
}